

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_ycbcr_conversion
          (StateRecorder *this,VkSamplerYcbcrConversion conv,
          VkSamplerYcbcrConversionCreateInfo *create_info)

{
  VkSamplerYcbcrConversionCreateInfo *pVVar1;
  bool bVar2;
  mapped_type *ppVVar3;
  mutex *__mutex;
  VkSamplerYcbcrConversionCreateInfo *new_info;
  VkSamplerYcbcrConversion local_30;
  VkSamplerYcbcrConversionCreateInfo *local_28;
  
  __mutex = &this->impl->record_lock;
  local_30 = conv;
  std::mutex::lock(__mutex);
  local_28 = (mapped_type)0x0;
  bVar2 = Impl::copy_ycbcr_conversion
                    (this->impl,create_info,&this->impl->ycbcr_temp_allocator,&local_28);
  pVVar1 = local_28;
  if (bVar2) {
    ppVVar3 = std::__detail::
              _Map_base<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->impl->ycbcr_conversions,&local_30);
    *ppVVar3 = pVVar1;
  }
  else {
    std::
    _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->impl->ycbcr_conversions)._M_h,&local_30);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar2) {
    Impl::pump_synchronized_recording(this->impl,this);
  }
  return bVar2;
}

Assistant:

bool StateRecorder::record_ycbcr_conversion(VkSamplerYcbcrConversion conv,
                                            const VkSamplerYcbcrConversionCreateInfo &create_info)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkSamplerYcbcrConversionCreateInfo *new_info = nullptr;
		if (!impl->copy_ycbcr_conversion(&create_info, impl->ycbcr_temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->ycbcr_conversions.erase(conv);
			return false;
		}

		// We don't directly serialize these objects. Just remember it for later if a VkSampler is created.
		impl->ycbcr_conversions[conv] = new_info;
	}

	impl->pump_synchronized_recording(this);
	return true;
}